

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGhsMultiGenerator::WriteMacros
          (cmGlobalGhsMultiGenerator *this,ostream *fout,cmLocalGenerator *root)

{
  cmMakefile *this_00;
  ostream *poVar1;
  cmValue cVar2;
  string *arg;
  pointer pbVar3;
  string_view arg_00;
  allocator<char> local_49;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expandedList;
  
  poVar1 = std::operator<<(fout,"macro PROJ_NAME=");
  cmLocalGenerator::GetProjectName_abi_cxx11_((string *)&expandedList,root);
  poVar1 = std::operator<<(poVar1,(string *)&expandedList);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string((string *)&expandedList);
  this_00 = root->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expandedList,"GHS_GPJ_MACROS",&local_49);
  cVar2 = cmMakefile::GetDefinition(this_00,(string *)&expandedList);
  std::__cxx11::string::~string((string *)&expandedList);
  if (cVar2.Value != (string *)0x0) {
    arg_00._M_str = ((cVar2.Value)->_M_dataplus)._M_p;
    arg_00._M_len = (cVar2.Value)->_M_string_length;
    cmExpandedList_abi_cxx11_(&expandedList,arg_00,false);
    for (pbVar3 = expandedList.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar3 != expandedList.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar3 = pbVar3 + 1) {
      poVar1 = std::operator<<(fout,"macro ");
      poVar1 = std::operator<<(poVar1,(string *)pbVar3);
      std::operator<<(poVar1,'\n');
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&expandedList);
  }
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteMacros(std::ostream& fout,
                                            cmLocalGenerator* root)
{
  fout << "macro PROJ_NAME=" << root->GetProjectName() << '\n';
  cmValue ghsGpjMacros = root->GetMakefile()->GetDefinition("GHS_GPJ_MACROS");
  if (ghsGpjMacros) {
    std::vector<std::string> expandedList = cmExpandedList(*ghsGpjMacros);
    for (std::string const& arg : expandedList) {
      fout << "macro " << arg << '\n';
    }
  }
}